

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge.cc
# Opt level: O0

void __thiscall prometheus::Gauge::Change(Gauge *this,double value)

{
  bool bVar1;
  double local_20;
  double current;
  double value_local;
  Gauge *this_local;
  
  current = value;
  value_local = (double)this;
  local_20 = std::atomic<double>::load(&this->value_,memory_order_seq_cst);
  do {
    bVar1 = std::atomic<double>::compare_exchange_weak
                      (&this->value_,&local_20,local_20 + current,memory_order_seq_cst);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void Gauge::Change(const double value) {
#if __cpp_lib_atomic_float >= 201711L
  value_.fetch_add(value);
#else
  // Pre-C++ 20 fallback: busy loop (which might be more expansive than using
  // fetch_add).
  auto current = value_.load();
  while (!value_.compare_exchange_weak(current, current + value)) {
    // intentionally empty block
  }
#endif
}